

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  Sphere *this;
  allocator local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  Image render;
  float local_98;
  float local_94;
  Vec3<float> local_90 [2];
  float local_78;
  float local_74;
  float local_70;
  Vec3<float> local_6c;
  Camera local_60;
  undefined1 local_50 [8];
  Scene scene;
  
  scene.camera.fov = 0.0;
  local_70 = 0.0;
  local_74 = 0.0;
  local_78 = 0.0;
  Raytracer::Vec3<float>::Vec3(&local_6c,&local_70,&local_74,&local_78);
  Raytracer::Camera::Camera(&local_60,&local_6c);
  Raytracer::Scene::Scene((Scene *)local_50,&local_60);
  Raytracer::Camera::~Camera(&local_60);
  Raytracer::Vec3<float>::~Vec3(&local_6c);
  this = (Sphere *)operator_new(0x18);
  render.width._3_1_ = 1;
  local_94 = 0.0;
  local_98 = 0.0;
  render.height = -0x3da40000;
  Raytracer::Vec3<float>::Vec3(local_90,&local_94,&local_98,(float *)&render.height);
  Raytracer::Sphere::Sphere(this,local_90,10.0);
  render.width._3_1_ = 0;
  Raytracer::Scene::addObject((Scene *)local_50,(Shape *)this);
  Raytracer::Vec3<float>::~Vec3(local_90);
  Raytracer::Image::Image((Image *)local_b0,1000,1000);
  Raytracer::Scene::start((Scene *)local_50,(Image *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"./file1.ppm",&local_d1);
  Raytracer::Image::Save((Image *)local_b0,(string *)local_d0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  scene.camera.fov = 0.0;
  Raytracer::Image::~Image((Image *)local_b0);
  Raytracer::Scene::~Scene((Scene *)local_50);
  return (int)scene.camera.fov;
}

Assistant:

int main() {
    Raytracer::Scene scene(Raytracer::Camera(Vec3f(0,0,0)));
    scene.addObject(new Raytracer::Sphere(Vec3f(0,0,-55),10));
    Raytracer::Image render(1000,1000);
    scene.start(render);
    render.Save("./file1.ppm");
    return 0;
}